

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_reporter.h
# Opt level: O2

void __thiscall bandit::detail::spec_reporter::it_starting(spec_reporter *this,char *desc)

{
  int *piVar1;
  ostream *poVar2;
  string local_40;
  
  piVar1 = &(this->super_progress_reporter).specs_run_;
  *piVar1 = *piVar1 + 1;
  poVar2 = this->stm_;
  indent_abi_cxx11_(&local_40,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  poVar2 = std::operator<<(poVar2,"- it ");
  poVar2 = std::operator<<(poVar2,desc);
  std::operator<<(poVar2," ... ");
  std::__cxx11::string::~string((string *)&local_40);
  std::ostream::flush();
  return;
}

Assistant:

virtual void it_starting(const char* desc)
    {
      progress_reporter::it_starting(desc);
      stm_ << indent() << "- it " << desc << " ... ";
      stm_.flush();
    }